

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined7 in_register_00000009;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  undefined7 uVar13;
  ulong uVar12;
  int iVar14;
  long lVar15;
  byte *pbVar16;
  byte *pbVar17;
  int iVar18;
  longdouble in_ST0;
  double dVar19;
  
  *pResult = 0.0;
  uVar4 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar4 == 1) {
    lVar11 = 1;
    uVar7 = 1;
    pbVar6 = (byte *)z;
  }
  else {
    for (lVar11 = (long)(int)(3 - uVar4); (lVar11 < length && (z[lVar11] == '\0'));
        lVar11 = lVar11 + 2) {
    }
    uVar7 = (uint)(length <= lVar11);
    length = (uint)lVar11 ^ 1;
    pbVar6 = (byte *)(z + (uVar4 & 1));
    lVar11 = 2;
  }
  pbVar17 = (byte *)(z + length);
  while( true ) {
    if (pbVar17 <= pbVar6) {
      return 0;
    }
    bVar1 = *pbVar6;
    if ((""[bVar1] & 1) == 0) break;
    pbVar6 = pbVar6 + lVar11;
  }
  lVar10 = 0;
  lVar15 = 0;
  if ((bVar1 - 0x2b & 0xfd) == 0) {
    lVar15 = lVar11;
  }
  pbVar16 = pbVar6 + lVar15;
  pbVar6 = pbVar6 + lVar15 + lVar11;
  iVar18 = 0;
  for (; ((pbVar16 < pbVar17 && (bVar2 = *pbVar16, (ulong)bVar2 - 0x30 < 10)) &&
         (lVar10 < 0xccccccccccccccb)); lVar10 = lVar10 * 10 + (long)(char)bVar2 + -0x30) {
    pbVar16 = pbVar16 + lVar11;
    iVar18 = iVar18 + 1;
    pbVar6 = pbVar6 + lVar11;
  }
  iVar14 = 0;
  for (; uVar13 = (undefined7)((ulong)pResult >> 8), pbVar16 < pbVar17; pbVar16 = pbVar16 + lVar11)
  {
    if ((ulong)*pbVar16 - 0x3a < 0xfffffffffffffff6) {
      iVar18 = iVar18 + iVar14;
      if (*pbVar16 == 0x2e) {
        for (; (pbVar16 = pbVar6, pbVar6 < pbVar17 && (0xfffffffffffffff5 < (ulong)*pbVar6 - 0x3a));
            pbVar6 = pbVar6 + lVar11) {
          if (lVar10 < 0xccccccccccccccb) {
            lVar10 = lVar10 * 10 + (long)(char)*pbVar6 + -0x30;
            iVar14 = iVar14 + -1;
          }
          iVar18 = iVar18 + 1;
        }
      }
      if (pbVar17 <= pbVar16) goto LAB_00144d3a;
      if ((*pbVar16 | 0x20) == 0x65) {
        pbVar16 = pbVar16 + lVar11;
        if (pbVar16 < pbVar17) {
          iVar5 = 1;
          if (*pbVar16 == 0x2b) {
            pbVar16 = pbVar16 + lVar11;
          }
          else if (*pbVar16 == 0x2d) {
            pbVar16 = pbVar16 + lVar11;
            iVar5 = -1;
          }
          iVar9 = 0;
          uVar12 = 0;
          for (; (pbVar16 < pbVar17 && (0xfffffffffffffff5 < (ulong)*pbVar16 - 0x3a));
              pbVar16 = pbVar16 + lVar11) {
            bVar3 = 9999 < iVar9;
            iVar9 = iVar9 * 10 + -0x30 + (int)(char)*pbVar16;
            if (bVar3) {
              iVar9 = 10000;
            }
            uVar12 = 1;
          }
          goto LAB_00144f0f;
        }
        iVar9 = 0;
        iVar5 = 1;
        uVar12 = 0;
      }
      else {
        uVar12 = CONCAT71(uVar13,1);
        iVar9 = 0;
        iVar5 = 1;
LAB_00144f0f:
        while ((pbVar16 < pbVar17 && ((""[*pbVar16] & 1) != 0))) {
          pbVar16 = pbVar16 + lVar11;
        }
      }
      goto LAB_00144d42;
    }
    iVar14 = iVar14 + 1;
    pbVar6 = pbVar6 + lVar11;
  }
  iVar18 = iVar18 + iVar14;
LAB_00144d3a:
  uVar12 = CONCAT71(uVar13,1);
  iVar9 = 0;
  iVar5 = 1;
LAB_00144d42:
  if (lVar10 == 0) {
    if (bVar1 == 0x2d) {
      dVar19 = -0.0;
    }
    else {
      dVar19 = 0.0;
    }
  }
  else {
    uVar8 = iVar9 * iVar5 + iVar14;
    uVar4 = -uVar8;
    if (0 < (int)uVar8) {
      uVar4 = uVar8;
    }
    while( true ) {
      if ((int)uVar4 < 1) break;
      if ((int)uVar8 < 0) {
        lVar11 = lVar10 / 10;
        if (lVar10 % 10 != 0) goto LAB_00144dac;
      }
      else {
        if (0xccccccccccccccb < lVar10) {
LAB_00144dac:
          lVar11 = -lVar10;
          if (bVar1 != 0x2d) {
            lVar11 = lVar10;
          }
          if (uVar4 < 0x134) goto LAB_00144dfe;
          if (uVar4 < 0x156) {
            sqlite3Pow10((longdouble *)(ulong)(uVar4 - 0x134),(int)uVar12);
            if ((int)uVar8 < 0) {
              dVar19 = (double)((longdouble)lVar11 / in_ST0) / 1e+308;
            }
            else {
              dVar19 = (double)((longdouble)lVar11 * in_ST0) * 1e+308;
            }
            uVar12 = uVar12 & 0xffffffff;
          }
          else if ((int)uVar8 < 0) {
            dVar19 = (double)((ulong)(double)lVar11 & 0x8000000000000000);
          }
          else {
            dVar19 = (double)lVar11 * INFINITY;
          }
          goto LAB_00144e97;
        }
        lVar11 = lVar10 * 10;
      }
      lVar10 = lVar11;
      uVar4 = uVar4 - 1;
    }
    lVar11 = -lVar10;
    if (bVar1 != 0x2d) {
      lVar11 = lVar10;
    }
    if (uVar4 == 0) {
      dVar19 = (double)lVar11;
    }
    else {
LAB_00144dfe:
      sqlite3Pow10((longdouble *)(ulong)uVar4,(int)uVar12);
      if ((int)uVar8 < 0) {
        in_ST0 = (longdouble)lVar11 / in_ST0;
      }
      else {
        in_ST0 = (longdouble)lVar11 * in_ST0;
      }
      uVar12 = uVar12 & 0xffffffff;
      dVar19 = (double)in_ST0;
    }
  }
LAB_00144e97:
  if (iVar18 < 1) {
    uVar7 = 0;
  }
  if (pbVar16 != pbVar17) {
    uVar7 = 0;
  }
  *pResult = dVar19;
  if ((uVar12 & 1) != 0) {
    return uVar7;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; nDigits++; d++; }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
      }
      z+=incr; nDigits++;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;

    /* This branch is needed to avoid a (harmless) buffer overread.  The 
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          LONGDOUBLE_TYPE scale = sqlite3Pow10(e-308);
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
#ifdef INFINITY
            result = INFINITY*s;
#else
            result = 1e308*1e308*s;  /* Infinity */
#endif
          }
        }
      }else{
        LONGDOUBLE_TYPE scale = sqlite3Pow10(e);
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z==zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}